

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O1

int nva_rsdefsz(nva_regspace *regspace)

{
  int iVar1;
  
  iVar1 = 1;
  if ((ulong)regspace->type < 0x15) {
    iVar1 = *(int *)(&DAT_00105264 + (ulong)regspace->type * 4);
  }
  return iVar1;
}

Assistant:

int nva_rsdefsz(struct nva_regspace *regspace) {
	switch (regspace->type) {
		case NVA_REGSPACE_BAR0:
		case NVA_REGSPACE_BAR1:
		case NVA_REGSPACE_BAR2:
		case NVA_REGSPACE_IOBAR:
		case NVA_REGSPACE_DPRAM:
		case NVA_REGSPACE_PIPE:
		case NVA_REGSPACE_RDI:
		case NVA_REGSPACE_RDIB:
		case NVA_REGSPACE_VCOMP_CODE:
		case NVA_REGSPACE_MACRO_CODE:
		case NVA_REGSPACE_XT:
			return 4;
		case NVA_REGSPACE_VCOMP_REG:
			return 8;
		default:
			return 1;
	}
}